

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

SockAddr * sk_namelookup(char *host,char **canonicalname,int address_family)

{
  int iVar1;
  char *pcVar2;
  SockAddr *pSVar3;
  addrinfo local_60;
  
  *canonicalname = (char *)0x0;
  if (*host == '/') {
    pcVar2 = dupstr(host);
    *canonicalname = pcVar2;
    pSVar3 = unix_sock_addr(host);
    return pSVar3;
  }
  pSVar3 = (SockAddr *)safemalloc(1,0x220,0);
  memset(pSVar3,0,0x220);
  pSVar3->refcount = 1;
  local_60.ai_addrlen = 0;
  local_60._20_4_ = 0;
  local_60.ai_next = (addrinfo *)0x0;
  iVar1 = 10;
  if (address_family != 2) {
    iVar1 = 0;
  }
  local_60.ai_family = 2;
  if (address_family != 1) {
    local_60.ai_family = iVar1;
  }
  local_60.ai_addr = (sockaddr *)0x0;
  local_60.ai_canonname = (char *)0x0;
  local_60.ai_flags = 2;
  local_60.ai_socktype = 1;
  local_60.ai_protocol = 0;
  pcVar2 = host_strduptrim(host);
  iVar1 = getaddrinfo(pcVar2,(char *)0x0,&local_60,(addrinfo **)&pSVar3->ais);
  safefree(pcVar2);
  if (pSVar3->ais == (addrinfo *)0x0) {
    pcVar2 = gai_strerror(iVar1);
    pSVar3->error = pcVar2;
  }
  else {
    pSVar3->superfamily = IP;
    pcVar2 = pSVar3->ais->ai_canonname;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = host;
    }
    pcVar2 = dupstr(pcVar2);
    *canonicalname = pcVar2;
  }
  return pSVar3;
}

Assistant:

SockAddr *sk_namelookup(const char *host, char **canonicalname,
                        int address_family)
{
    *canonicalname = NULL;

    if (host[0] == '/') {
        *canonicalname = dupstr(host);
        return unix_sock_addr(host);
    }

    SockAddr *addr = snew(SockAddr);
    memset(addr, 0, sizeof(SockAddr));
    addr->superfamily = UNRESOLVED;
    addr->refcount = 1;

#ifndef NO_IPV6
    /*
     * Use getaddrinfo, as long as it's available. This should handle
     * both IPv4 and IPv6 address literals, and hostnames, in one
     * unified API.
     */
    {
        struct addrinfo hints;
        memset(&hints, 0, sizeof(hints));
        hints.ai_family = (address_family == ADDRTYPE_IPV4 ? AF_INET :
                           address_family == ADDRTYPE_IPV6 ? AF_INET6 :
                           AF_UNSPEC);
        hints.ai_flags = AI_CANONNAME;
        hints.ai_socktype = SOCK_STREAM;

        /* strip [] on IPv6 address literals */
        char *trimmed_host = host_strduptrim(host);
        int err = getaddrinfo(trimmed_host, NULL, &hints, &addr->ais);
        sfree(trimmed_host);

        if (addr->ais) {
            addr->superfamily = IP;
            if (addr->ais->ai_canonname)
                *canonicalname = dupstr(addr->ais->ai_canonname);
            else
                *canonicalname = dupstr(host);
        } else {
            addr->error = gai_strerror(err);
        }
        return addr;
    }

#else
    /*
     * Failing that (if IPv6 support was not compiled in), try the
     * old-fashioned approach, which is to start by manually checking
     * for an IPv4 literal and then use gethostbyname.
     */
    unsigned long a = inet_addr(host);
    if (a != (unsigned long) INADDR_NONE) {
        addr->addresses = snew(unsigned long);
        addr->naddresses = 1;
        addr->addresses[0] = ntohl(a);
        addr->superfamily = IP;
        *canonicalname = dupstr(host);
        return addr;
    }

    struct hostent *h = gethostbyname(host);
    if (h) {
        addr->superfamily = IP;

        size_t n;
        for (n = 0; h->h_addr_list[n]; n++);
        addr->addresses = snewn(n, unsigned long);
        addr->naddresses = n;
        for (n = 0; n < addr->naddresses; n++) {
            uint32_t a;
            memcpy(&a, h->h_addr_list[n], sizeof(a));
            addr->addresses[n] = ntohl(a);
        }

        *canonicalname = dupstr(h->h_name);
    } else {
        addr->error = hstrerror(h_errno);
    }
    return addr;
#endif
}